

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

void __thiscall
moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
::~ConcurrentQueue(ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
                   *this)

{
  ProducerBase *pPVar1;
  ImplicitProducerHash *pIVar2;
  Block *pBVar3;
  __pointer_type next_1;
  Block *block;
  size_t i;
  ImplicitProducerHash *prev;
  __pointer_type hash;
  ProducerBase *next;
  __pointer_type ptr;
  ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
  *this_local;
  
  next = std::
         atomic<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
         ::load(&this->producerListTail,memory_order_relaxed);
  while (next != (ProducerBase *)0x0) {
    pPVar1 = ProducerBase::next_prod(next);
    if ((next->super_ConcurrentQueueProducerTypelessBase).token != (ProducerToken *)0x0) {
      ((next->super_ConcurrentQueueProducerTypelessBase).token)->producer =
           (ConcurrentQueueProducerTypelessBase *)0x0;
    }
    ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::
    destroy<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase>
              (next);
    next = pPVar1;
  }
  pIVar2 = std::
           atomic<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
           ::load(&this->implicitProducerHash,memory_order_relaxed);
  while (prev = pIVar2, prev != (ImplicitProducerHash *)0x0) {
    pIVar2 = prev->prev;
    if (pIVar2 != (ImplicitProducerHash *)0x0) {
      for (block = (Block *)0x0; block != (Block *)prev->capacity;
          block = (Block *)((long)&block->field_0 + 1)) {
      }
      ConcurrentQueueDefaultTraits::free(prev);
    }
  }
  pBVar3 = FreeList<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::Block>
           ::head_unsafe(&this->freeList);
  while (next_1 = pBVar3, next_1 != (__pointer_type)0x0) {
    pBVar3 = std::
             atomic<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
             ::load(&next_1->freeListNext,memory_order_relaxed);
    if ((next_1->dynamicallyAllocated & 1U) != 0) {
      ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::
      destroy<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::Block>
                (next_1);
    }
  }
  ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::
  destroy_array<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::Block>
            (this->initialBlockPool,this->initialBlockPoolSize);
  return;
}

Assistant:

~ConcurrentQueue()
	{
		// Destroy producers
		auto ptr = producerListTail.load(std::memory_order_relaxed);
		while (ptr != nullptr) {
			auto next = ptr->next_prod();
			if (ptr->token != nullptr) {
				ptr->token->producer = nullptr;
			}
			destroy(ptr);
			ptr = next;
		}
		
		// Destroy implicit producer hash tables
		if (INITIAL_IMPLICIT_PRODUCER_HASH_SIZE != 0) {
			auto hash = implicitProducerHash.load(std::memory_order_relaxed);
			while (hash != nullptr) {
				auto prev = hash->prev;
				if (prev != nullptr) {		// The last hash is part of this object and was not allocated dynamically
					for (size_t i = 0; i != hash->capacity; ++i) {
						hash->entries[i].~ImplicitProducerKVP();
					}
					hash->~ImplicitProducerHash();
					(Traits::free)(hash);
				}
				hash = prev;
			}
		}
		
		// Destroy global free list
		auto block = freeList.head_unsafe();
		while (block != nullptr) {
			auto next = block->freeListNext.load(std::memory_order_relaxed);
			if (block->dynamicallyAllocated) {
				destroy(block);
			}
			block = next;
		}
		
		// Destroy initial free list
		destroy_array(initialBlockPool, initialBlockPoolSize);
	}